

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.h
# Opt level: O2

int double_conversion::Bignum::Compare(Bignum *a,Bignum *b)

{
  short sVar1;
  short sVar2;
  Chunk CVar3;
  Chunk CVar4;
  int iVar5;
  int iVar6;
  int index;
  
  sVar2 = a->exponent_;
  index = (int)a->used_bigits_ + (int)sVar2;
  sVar1 = b->exponent_;
  iVar5 = (int)b->used_bigits_ + (int)sVar1;
  iVar6 = -1;
  if (iVar5 <= index) {
    if (iVar5 < index) {
      iVar6 = 1;
    }
    else {
      if (sVar1 < sVar2) {
        sVar2 = sVar1;
      }
      do {
        if (index <= sVar2) {
          return 0;
        }
        index = index + -1;
        CVar3 = BigitOrZero(a,index);
        CVar4 = BigitOrZero(b,index);
        if (CVar3 < CVar4) {
          return -1;
        }
      } while (CVar3 <= CVar4);
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int BigitLength() const { return used_bigits_ + exponent_; }